

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

Cba_Man_t * Cba_ManExtractGroup(Cba_Man_t *p,Vec_Int_t *vObjs)

{
  int *piVar1;
  int nIns;
  int nOuts;
  char *pFileName;
  Hash_IntMan_t *vHash;
  Abc_Nam_t *pStrs;
  Abc_Nam_t *pFuns;
  Abc_Nam_t *pMods;
  Cba_Man_t *p_00;
  Cba_Ntk_t *p_01;
  Vec_Int_t *pVVar2;
  Vec_Int_t *vFonOuts;
  Cba_Ntk_t *pNtk;
  int local_44;
  Vec_Int_t *local_40;
  int local_34;
  
  pFileName = p->pSpec;
  pStrs = Abc_NamRef(p->pStrs);
  pFuns = Abc_NamRef(p->pFuns);
  pMods = Abc_NamStart(100,0x18);
  vHash = p->vHash;
  piVar1 = &vHash->nRefs;
  *piVar1 = *piVar1 + 1;
  p_00 = Cba_ManAlloc(pFileName,1,pStrs,pFuns,pMods,vHash);
  p_01 = Cba_ManRoot(p);
  pVVar2 = Cba_NtkCollectInFons(p_01,vObjs);
  vFonOuts = Cba_NtkCollectOutFons(p_01,vObjs);
  memcpy(p_00->pTypeNames,p->pTypeNames,0x2d0);
  Cba_NtkCollectGroupStats(p_01,vObjs,&local_34,&local_44);
  nIns = pVVar2->nSize;
  nOuts = vFonOuts->nSize;
  local_40 = pVVar2;
  pNtk = Cba_NtkAlloc(p_00,p_01->NameId,nIns,nOuts,vObjs->nSize + nIns + nOuts,local_34 + nOuts,
                      local_44 + nIns);
  Cba_NtkAdd(p_00,pNtk);
  if (0 < (p_01->vObjName).nSize) {
    Cba_NtkCleanObjNames(pNtk);
  }
  if (0 < (p_01->vFonName).nSize) {
    Cba_NtkCleanFonNames(pNtk);
  }
  pVVar2 = local_40;
  Cba_ManExtractGroupInt(pNtk,p_01,vObjs,local_40,vFonOuts);
  Cba_NtkMissingFonNames(pNtk,"b");
  Vec_IntFree(pVVar2);
  Vec_IntFree(vFonOuts);
  return p_00;
}

Assistant:

Cba_Man_t * Cba_ManExtractGroup( Cba_Man_t * p, Vec_Int_t * vObjs )
{
    Cba_Man_t * pNew  = Cba_ManAlloc( p->pSpec, 1, Abc_NamRef(p->pStrs), Abc_NamRef(p->pFuns), Abc_NamStart(100, 24), Hash_IntManRef(p->vHash) );
    Cba_Ntk_t * pRoot = Cba_ManRoot( p ), * pRootNew;
    Vec_Int_t * vFonIns = Cba_NtkCollectInFons( pRoot, vObjs );
    Vec_Int_t * vFonOuts = Cba_NtkCollectOutFons( pRoot, vObjs );
    int nObjs, nFins, nFons;
    Cba_ManDupTypeNames( pNew, p );
    // collect stats
    Cba_NtkCollectGroupStats( pRoot, vObjs, &nFins, &nFons );
    nObjs  = Vec_IntSize(vObjs) + Vec_IntSize(vFonIns) + Vec_IntSize(vFonOuts);
    nFins += Vec_IntSize(vFonOuts);
    nFons += Vec_IntSize(vFonIns);
    // create network
    pRootNew = Cba_NtkAlloc( pNew, Cba_NtkNameId(pRoot), Vec_IntSize(vFonIns), Vec_IntSize(vFonOuts), nObjs, nFins, nFons );
    Cba_NtkAdd( pNew, pRootNew );
    if ( Cba_NtkHasObjNames(pRoot) )
        Cba_NtkCleanObjNames( pRootNew );
    if ( Cba_NtkHasFonNames(pRoot) )
        Cba_NtkCleanFonNames( pRootNew );
    // add group nodes
    Cba_ManExtractGroupInt( pRootNew, pRoot, vObjs, vFonIns, vFonOuts );
    Cba_NtkMissingFonNames( pRootNew, "b" );
    //Cba_NtkPrepareSeq( pRootNew );
    // cleanup
    Vec_IntFree( vFonIns );
    Vec_IntFree( vFonOuts );
    return pNew;
}